

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O2

void c352_write_rom(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  C352 *c;
  
  uVar1 = *(uint *)((long)chip + 0x498);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)chip + 0x490)),data,__n);
  return;
}

Assistant:

static void c352_write_rom(void *chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	C352 *c = (C352 *)chip;
	
	if (offset > c->wavesize)
		return;
	if (offset + length > c->wavesize)
		length = c->wavesize - offset;
	
	memcpy(c->wave + offset, data, length);
	
	return;
}